

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

Matrix4x4 * __thiscall
CMU462::Camera::getTransformation(Matrix4x4 *__return_storage_ptr__,Camera *this)

{
  double dVar1;
  double *pdVar2;
  int x;
  int i;
  int y;
  int j;
  Matrix4x4 ret;
  Matrix4x4 retmul;
  Vector3D local_1c8;
  Matrix4x4 local_1b0;
  Matrix4x4 local_130;
  Matrix4x4 local_b0;
  
  Matrix4x4::identity();
  for (i = 0; i != 3; i = i + 1) {
    for (j = 0; j != 3; j = j + 1) {
      pdVar2 = Matrix3x3::operator()(&this->c2w,i,j);
      dVar1 = *pdVar2;
      pdVar2 = Matrix4x4::operator()(&local_1b0,i,j);
      *pdVar2 = dVar1;
    }
  }
  local_1c8.x = (this->pos).x;
  local_1c8.y = (this->pos).y;
  local_1c8.z = (this->pos).z;
  Matrix4x4::translation(&local_1c8);
  Matrix4x4::operator*(&local_130,&local_b0,&local_1b0);
  Matrix4x4::inv(__return_storage_ptr__,&local_130);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Camera::getTransformation() {
  Matrix4x4 ret = Matrix4x4::identity();
  for(int x = 0; x < 3; ++x)
    for(int y = 0; y < 3; ++y)
      ret(x, y) = c2w(x, y);

  Matrix4x4 retmul = Matrix4x4::translation(pos);

  return (retmul * ret).inv();
}